

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

void __thiscall pbrt::BSDF::Regularize(BSDF *this)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  ulong uVar7;
  float fVar8;
  ushort uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar10 = (this->bxdf).
           super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           .bits;
  uVar9 = (ushort)(uVar10 >> 0x30);
  if ((uint)(uVar10 >> 0x31) < 3) {
    if (2 < uVar9) {
      uVar10 = uVar10 & 0xffffffffffff;
      if (uVar9 != 4) {
        fVar6 = (float)*(undefined8 *)(uVar10 + 4);
        fVar8 = (float)((ulong)*(undefined8 *)(uVar10 + 4) >> 0x20);
        auVar14._0_4_ = fVar6 + fVar6;
        auVar14._4_4_ = fVar8 + fVar8;
        auVar14._8_8_ = 0;
        auVar17._8_4_ = 0x3dcccccd;
        auVar17._0_8_ = 0x3dcccccd3dcccccd;
        auVar17._12_4_ = 0x3dcccccd;
        uVar7 = vcmpps_avx512vl(auVar14,auVar17,1);
        auVar20._8_4_ = 0x3e99999a;
        auVar20._0_8_ = 0x3e99999a3e99999a;
        auVar20._12_4_ = 0x3e99999a;
        auVar15 = vminps_avx(auVar20,auVar14);
        bVar2 = (bool)((byte)uVar7 & 1);
        auVar11._0_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._0_4_;
        bVar2 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar11._4_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._4_4_;
        bVar2 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar11._8_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._8_4_;
        bVar2 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar11._12_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._12_4_;
        uVar1 = vmovlps_avx(auVar11);
        *(undefined8 *)(uVar10 + 4) = uVar1;
        return;
      }
      auVar13._0_4_ = *(float *)(uVar10 + 4) + *(float *)(uVar10 + 4);
      auVar13._4_4_ = *(float *)(uVar10 + 8) + *(float *)(uVar10 + 8);
      auVar13._8_4_ = *(float *)(uVar10 + 0xc) + *(float *)(uVar10 + 0xc);
      auVar13._12_4_ = *(float *)(uVar10 + 0x10) + *(float *)(uVar10 + 0x10);
      auVar16._8_4_ = 0x3dcccccd;
      auVar16._0_8_ = 0x3dcccccd3dcccccd;
      auVar16._12_4_ = 0x3dcccccd;
      uVar7 = vcmpps_avx512vl(auVar13,auVar16,1);
      auVar19._8_4_ = 0x3e99999a;
      auVar19._0_8_ = 0x3e99999a3e99999a;
      auVar19._12_4_ = 0x3e99999a;
      auVar15 = vminps_avx(auVar19,auVar13);
      bVar2 = (bool)((byte)uVar7 & 1);
      bVar3 = (bool)((byte)(uVar7 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      *(uint *)(uVar10 + 4) = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._0_4_;
      *(uint *)(uVar10 + 8) = (uint)bVar3 * 0x3dcccccd | (uint)!bVar3 * auVar15._4_4_;
      *(uint *)(uVar10 + 0xc) = (uint)bVar4 * 0x3dcccccd | (uint)!bVar4 * auVar15._8_4_;
      *(uint *)(uVar10 + 0x10) = (uint)bVar5 * 0x3dcccccd | (uint)!bVar5 * auVar15._12_4_;
      return;
    }
  }
  else if (uVar9 == 9) {
    uVar1 = *(undefined8 *)(uVar10 & 0xffffffffffff);
    fVar6 = (float)uVar1;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    auVar15._0_4_ = fVar6 + fVar6;
    auVar15._4_4_ = fVar8 + fVar8;
    auVar15._8_8_ = 0;
    auVar18._8_4_ = 0x3dcccccd;
    auVar18._0_8_ = 0x3dcccccd3dcccccd;
    auVar18._12_4_ = 0x3dcccccd;
    uVar7 = vcmpps_avx512vl(auVar15,auVar18,1);
    auVar21._8_4_ = 0x3e99999a;
    auVar21._0_8_ = 0x3e99999a3e99999a;
    auVar21._12_4_ = 0x3e99999a;
    auVar15 = vminps_avx(auVar21,auVar15);
    bVar2 = (bool)((byte)uVar7 & 1);
    auVar12._0_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._0_4_;
    bVar2 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar12._4_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._4_4_;
    bVar2 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar12._8_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._8_4_;
    bVar2 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar12._12_4_ = (uint)bVar2 * 0x3dcccccd | (uint)!bVar2 * auVar15._12_4_;
    uVar1 = vmovlps_avx(auVar12);
    *(undefined8 *)(uVar10 & 0xffffffffffff) = uVar1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }